

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_17b8f50::BlendA64MaskTest8B_RandomValues_Test::TestBody
          (BlendA64MaskTest8B_RandomValues_Test *this)

{
  ACMRandom *this_00;
  bool bVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  int bsize;
  int block_size;
  long lVar4;
  
  this_00 = &(this->super_BlendA64MaskTest8B).
             super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int)>
             .rng_;
  block_size = 0;
  while( true ) {
    if (block_size == 0x16) {
      return;
    }
    bVar1 = testing::Test::HasFatalFailure();
    if (bVar1) break;
    for (lVar4 = 0x3c048; lVar4 != 0x50048; lVar4 = lVar4 + 1) {
      uVar2 = libaom_test::ACMRandom::Rand8(this_00);
      *(uint8_t *)((long)this + lVar4 + -0x3c010) = uVar2;
      uVar2 = libaom_test::ACMRandom::Rand8(this_00);
      *(uint8_t *)((long)this + lVar4 + -0x28010) = uVar2;
      uVar2 = libaom_test::ACMRandom::Rand8(this_00);
      *(uint8_t *)((long)this + lVar4 + -0x14008) = uVar2;
      uVar2 = libaom_test::ACMRandom::Rand8(this_00);
      (this->super_BlendA64MaskTest8B).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
      .dst_ref_[lVar4 + -0x38] = uVar2;
    }
    for (lVar4 = 0x50050; lVar4 != 0x60050; lVar4 = lVar4 + 1) {
      uVar3 = testing::internal::Random::Generate(&this_00->random_,0x41);
      (this->super_BlendA64MaskTest8B).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
      .dst_ref_[lVar4 + -0x38] = (uchar)uVar3;
    }
    BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
    ::RunTest((BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
               *)this,block_size,1);
    block_size = block_size + 1;
  }
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B, RandomValues) {
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure(); ++bsize) {
    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_.Rand8();
      dst_tst_[i] = rng_.Rand8();

      src0_[i] = rng_.Rand8();
      src1_[i] = rng_.Rand8();
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

    RunTest(bsize, 1);
  }
}